

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O2

void asm_fusefref(ASMState *as,IRIns *ir,RegSet allow)

{
  byte bVar1;
  ushort uVar2;
  uint8_t uVar3;
  Reg RVar4;
  
  bVar1 = "\f\b\x10\x10\b\x14\x18\x1c\x06\x10\x06\x18\x06\b\b\b\f"[(ir->field_0).op2];
  (as->mrm).ofs = (uint)bVar1;
  (as->mrm).idx = 0x80;
  uVar2 = (ir->field_0).op1;
  if ((long)(short)uVar2 < 0) {
    RVar4 = ra_alloc1(as,(uint)uVar2,allow);
    uVar3 = (uint8_t)RVar4;
  }
  else {
    (as->mrm).ofs = (uint)bVar1 + as->ir[(short)uVar2].field_1.op12;
    uVar3 = 0x80;
  }
  (as->mrm).base = uVar3;
  return;
}

Assistant:

static void asm_fusefref(ASMState *as, IRIns *ir, RegSet allow)
{
  lua_assert(ir->o == IR_FLOAD || ir->o == IR_FREF);
  as->mrm.ofs = field_ofs[ir->op2];
  as->mrm.idx = RID_NONE;
  if (irref_isk(ir->op1)) {
    as->mrm.ofs += IR(ir->op1)->i;
    as->mrm.base = RID_NONE;
  } else {
    as->mrm.base = (uint8_t)ra_alloc1(as, ir->op1, allow);
  }
}